

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall
spvtools::opt::CFG::ComputeStructuredOrder
          (CFG *this,Function *func,BasicBlock *root,BasicBlock *end,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order)

{
  bool bVar1;
  IRContext *this_00;
  FeatureManager *this_01;
  function<bool_(const_spvtools::opt::BasicBlock_*)> local_d0;
  function<void_(const_spvtools::opt::BasicBlock_*)> local_b0;
  function<void_(const_spvtools::opt::BasicBlock_*)> local_90;
  get_blocks_func local_70;
  anon_class_8_1_a86b766e local_50;
  anon_class_8_1_a86b766e post_order;
  anon_class_8_1_8991fb9c get_structured_successors;
  anon_class_8_1_ba1d443b terminal;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *plStack_30;
  anon_class_1_0_00000001 ignore_block;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order_local;
  BasicBlock *end_local;
  BasicBlock *root_local;
  Function *func_local;
  CFG *this_local;
  
  plStack_30 = order;
  this_00 = Module::context(this->module_);
  this_01 = IRContext::get_feature_mgr(this_00);
  bVar1 = FeatureManager::HasCapability(this_01,CapabilityShader);
  if (!bVar1) {
    __assert_fail("module_->context()->get_feature_mgr()->HasCapability( spv::Capability::Shader) && \"This only works on structured control flow\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0x55,
                  "void spvtools::opt::CFG::ComputeStructuredOrder(Function *, BasicBlock *, BasicBlock *, std::list<BasicBlock *> *)"
                 );
  }
  ComputeStructuredSuccessors(this,func);
  local_50.order = &stack0xffffffffffffffd0;
  post_order.order =
       (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> **)this;
  get_structured_successors.this = (CFG *)end;
  std::
  function<std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>const*(spvtools::opt::BasicBlock_const*)>
  ::
  function<spvtools::opt::CFG::ComputeStructuredOrder(spvtools::opt::Function*,spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::__cxx11::list<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>*)::__0&,void>
            ((function<std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>const*(spvtools::opt::BasicBlock_const*)>
              *)&local_70,(anon_class_8_1_8991fb9c *)&post_order);
  std::function<void(spvtools::opt::BasicBlock_const*)>::
  function<spvtools::opt::CFG::ComputeStructuredOrder(spvtools::opt::Function*,spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::__cxx11::list<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>*)::__1&,void>
            ((function<void(spvtools::opt::BasicBlock_const*)> *)&local_90,
             (anon_class_1_0_00000001 *)((long)&terminal.end + 7));
  std::function<void(spvtools::opt::BasicBlock_const*)>::
  function<spvtools::opt::CFG::ComputeStructuredOrder(spvtools::opt::Function*,spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::__cxx11::list<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>*)::__2&,void>
            ((function<void(spvtools::opt::BasicBlock_const*)> *)&local_b0,&local_50);
  std::function<bool(spvtools::opt::BasicBlock_const*)>::
  function<spvtools::opt::CFG::ComputeStructuredOrder(spvtools::opt::Function*,spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::__cxx11::list<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>*)::__3&,void>
            ((function<bool(spvtools::opt::BasicBlock_const*)> *)&local_d0,
             (anon_class_8_1_ba1d443b *)&get_structured_successors);
  CFA<spvtools::opt::BasicBlock>::DepthFirstTraversal(root,&local_70,&local_90,&local_b0,&local_d0);
  std::function<bool_(const_spvtools::opt::BasicBlock_*)>::~function(&local_d0);
  std::function<void_(const_spvtools::opt::BasicBlock_*)>::~function(&local_b0);
  std::function<void_(const_spvtools::opt::BasicBlock_*)>::~function(&local_90);
  std::
  function<const_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_*(const_spvtools::opt::BasicBlock_*)>
  ::~function(&local_70);
  return;
}

Assistant:

void CFG::ComputeStructuredOrder(Function* func, BasicBlock* root,
                                 BasicBlock* end,
                                 std::list<BasicBlock*>* order) {
  assert(module_->context()->get_feature_mgr()->HasCapability(
             spv::Capability::Shader) &&
         "This only works on structured control flow");

  // Compute structured successors and do DFS.
  ComputeStructuredSuccessors(func);
  auto ignore_block = [](cbb_ptr) {};
  auto terminal = [end](cbb_ptr bb) { return bb == end; };

  auto get_structured_successors = [this](const BasicBlock* b) {
    return &(block2structured_succs_[b]);
  };

  // TODO(greg-lunarg): Get rid of const_cast by making moving const
  // out of the cfa.h prototypes and into the invoking code.
  auto post_order = [&](cbb_ptr b) {
    order->push_front(const_cast<BasicBlock*>(b));
  };
  CFA<BasicBlock>::DepthFirstTraversal(root, get_structured_successors,
                                       ignore_block, post_order, terminal);
}